

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_update_camera3d(rf_camera3d *camera,rf_camera3d_state *state,
                       rf_input_state_for_update_camera input_state)

{
  rf_builtin_camera3d_mode rVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar12;
  float fVar13;
  float fVar14;
  _Bool direction [6];
  char local_5d [5];
  undefined1 local_58 [16];
  float local_3c;
  float local_38;
  float local_34;
  
  local_58._8_8_ = local_58._0_8_;
  local_58._0_8_ = camera;
  local_5d[0] = input_state.direction_keys[1];
  local_5d[1] = input_state.direction_keys[2];
  local_5d[2] = input_state.direction_keys[3];
  local_5d[3] = input_state.direction_keys[4];
  local_5d[4] = input_state.direction_keys[5];
  rVar1 = state->camera_mode;
  if (rVar1 == RF_CAMERA_CUSTOM) {
    fVar14 = 0.0;
    fVar13 = 0.0;
  }
  else {
    fVar13 = input_state.mouse_position.x - (state->previous_mouse_position).x;
    fVar14 = input_state.mouse_position.y - (state->previous_mouse_position).y;
    (state->previous_mouse_position).x = input_state.mouse_position.x;
    (state->previous_mouse_position).y = input_state.mouse_position.y;
  }
  switch(rVar1) {
  case RF_CAMERA_FREE:
    fVar7 = state->camera_target_distance;
    if (input_state.mouse_wheel_move < 0 && fVar7 < 120.0) {
      fVar7 = fVar7 + (float)input_state.mouse_wheel_move * -1.5;
      state->camera_target_distance = fVar7;
      if (120.0 < fVar7) {
        state->camera_target_distance = 120.0;
      }
    }
    else {
      fVar8 = (camera->position).y;
      fVar9 = (camera->target).y;
      bVar5 = fVar7 == 120.0 && input_state.mouse_wheel_move < 0;
      if ((fVar9 < fVar8 && bVar5) || ((fVar9 < fVar8 && (0.0 <= fVar9)))) {
LAB_00126f02:
        fVar12 = (float)input_state.mouse_wheel_move;
        fVar10 = (camera->target).x;
        fVar11 = (camera->target).z;
        (camera->target).x = ((fVar10 - (camera->position).x) * fVar12 * 1.5) / fVar7 + fVar10;
        (camera->target).y = ((fVar9 - fVar8) * fVar12 * 1.5) / fVar7 + fVar9;
        (camera->target).z = ((fVar11 - (camera->position).z) * fVar12 * 1.5) / fVar7 + fVar11;
      }
      else {
        if ((fVar8 <= fVar9) || (input_state.mouse_wheel_move < 1 || 0.0 <= fVar9)) {
          if ((fVar8 < fVar9 && bVar5) || ((fVar8 < fVar9 && (fVar9 <= 0.0)))) goto LAB_00126f02;
          if ((fVar9 <= fVar8) || (input_state.mouse_wheel_move < 1 || fVar9 <= 0.0))
          goto LAB_00126f6f;
        }
        fVar7 = fVar7 + (float)input_state.mouse_wheel_move * -1.5;
        state->camera_target_distance = fVar7;
        if (fVar7 < 0.3) {
          state->camera_target_distance = 0.3;
        }
      }
    }
LAB_00126f6f:
    if (input_state.is_camera_pan_control_key_down != false) {
      if (input_state.is_camera_alt_control_key_down == false) {
        local_58._0_4_ = fVar13 * -0.01;
        fVar7 = cosf((state->camera_angle).x);
        fVar14 = fVar14 * 0.01;
        fVar8 = sinf((state->camera_angle).x);
        fVar9 = sinf((state->camera_angle).y);
        (camera->target).x =
             (state->camera_target_distance / 5.1) *
             (fVar7 * (float)local_58._0_4_ + fVar9 * fVar8 * fVar14) + (camera->target).x;
        fVar7 = cosf((state->camera_angle).y);
        (camera->target).y =
             (state->camera_target_distance / 5.1) * fVar7 * fVar14 + (camera->target).y;
        local_58._0_4_ = sinf((state->camera_angle).x);
        fVar7 = cosf((state->camera_angle).x);
        fVar8 = sinf((state->camera_angle).y);
        (camera->target).z =
             (state->camera_target_distance / 5.1) *
             ((float)local_58._0_4_ * fVar13 * 0.01 + fVar8 * fVar7 * fVar14) + (camera->target).z;
      }
      else if (input_state.is_camera_smooth_zoom_control_key == false) {
        (state->camera_angle).x = fVar13 * -0.01 + (state->camera_angle).x;
        fVar14 = fVar14 * -0.01 + (state->camera_angle).y;
        (state->camera_angle).y = fVar14;
        if (fVar14 <= 1.4835298) {
          if (fVar14 < -1.4835298) {
            (state->camera_angle).y = -1.4835298;
          }
        }
        else {
          (state->camera_angle).y = 1.4835298;
        }
      }
      else {
        state->camera_target_distance = fVar14 * 0.05 + state->camera_target_distance;
      }
    }
    fVar14 = sinf((state->camera_angle).x);
    local_58._0_4_ = fVar14 * state->camera_target_distance;
    fVar14 = cosf((state->camera_angle).y);
    (camera->position).x = fVar14 * (float)local_58._0_4_ + (camera->target).x;
    fVar14 = (state->camera_angle).y;
    local_58 = ZEXT416((uint)fVar14);
    fVar14 = sinf(fVar14);
    local_58._4_4_ =
         ~local_58._4_4_ & (extraout_XMM0_Db ^ 0x80000000) | extraout_XMM0_Db & local_58._4_4_;
    local_58._0_4_ =
         (float)(~-(uint)((float)local_58._0_4_ <= 0.0) & (uint)-fVar14 |
                (uint)fVar14 & -(uint)((float)local_58._0_4_ <= 0.0)) *
         state->camera_target_distance;
    local_58._8_4_ =
         ~local_58._8_4_ & (extraout_XMM0_Dc ^ 0x80000000) | extraout_XMM0_Dc & local_58._8_4_;
    local_58._12_4_ =
         ~local_58._12_4_ & (extraout_XMM0_Dd ^ 0x80000000) | extraout_XMM0_Dd & local_58._12_4_;
    fVar14 = sinf((state->camera_angle).y);
    (camera->position).y = fVar14 * (float)local_58._0_4_ + (camera->target).y;
    fVar14 = cosf((state->camera_angle).x);
    local_58._0_4_ = fVar14 * state->camera_target_distance;
    fVar7 = cosf((state->camera_angle).y);
    fVar7 = fVar7 * (float)local_58._0_4_;
    goto LAB_00127187;
  case RF_CAMERA_ORBITAL:
    fVar13 = (state->camera_angle).x + 0.01;
    (state->camera_angle).x = fVar13;
    fVar7 = (float)input_state.mouse_wheel_move * -1.5 + state->camera_target_distance;
    fVar14 = 1.2;
    if (1.2 <= fVar7) {
      fVar14 = fVar7;
    }
    state->camera_target_distance = fVar14;
    fVar13 = sinf(fVar13);
    fVar14 = state->camera_target_distance;
    fVar7 = cosf((state->camera_angle).y);
    camera = (rf_camera3d *)local_58._0_8_;
    ((rf_vec3 *)(local_58._0_8_ + 4))->x =
         fVar7 * fVar13 * fVar14 + ((rf_vec3 *)(local_58._0_8_ + 0x10))->x;
    fVar14 = (state->camera_angle).y;
    fVar13 = sinf(fVar14);
    uVar6 = -(uint)(fVar14 <= 0.0);
    fVar13 = (float)(~uVar6 & (uint)-fVar13 | (uint)fVar13 & uVar6) * state->camera_target_distance;
    break;
  case RF_CAMERA_FIRST_PERSON:
    fVar7 = sinf((state->camera_angle).x);
    fVar8 = (float)input_state.direction_keys[1];
    fVar9 = sinf((state->camera_angle).x);
    fVar12 = (float)input_state.direction_keys[0];
    fVar10 = cosf((state->camera_angle).x);
    local_38 = (float)input_state.direction_keys[3];
    fVar10 = fVar10 * local_38;
    fVar11 = cosf((state->camera_angle).x);
    local_3c = (float)input_state.direction_keys[2];
    uVar2 = local_58._0_8_;
    *(float *)(local_58._0_8_ + 4) =
         (fVar11 * local_3c + ((fVar7 * fVar8 - fVar9 * fVar12) - fVar10)) / 20.0 +
         *(float *)(local_58._0_8_ + 4);
    fVar7 = sinf((state->camera_angle).y);
    fVar9 = sinf((state->camera_angle).y);
    *(float *)(uVar2 + 8) =
         (((float)input_state.direction_keys[4] + (fVar7 * fVar12 - fVar9 * fVar8)) -
         (float)input_state.direction_keys[5]) / 20.0 + *(float *)(uVar2 + 8);
    fVar7 = cosf((state->camera_angle).x);
    fVar9 = cosf((state->camera_angle).x);
    fVar10 = sinf((state->camera_angle).x);
    fVar10 = fVar10 * local_38;
    fVar11 = sinf((state->camera_angle).x);
    *(float *)(uVar2 + 0xc) =
         ((fVar10 + (fVar7 * fVar8 - fVar9 * fVar12)) - fVar11 * local_3c) / 20.0 +
         *(float *)(uVar2 + 0xc);
    bVar5 = true;
    if (input_state.direction_keys[0] == false) {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (uVar4 == 5) break;
        uVar3 = uVar4 + 1;
      } while (local_5d[uVar4] != '\x01');
      bVar5 = uVar4 < 5;
    }
    fVar13 = fVar13 * -0.003 + (state->camera_angle).x;
    (state->camera_angle).x = fVar13;
    fVar7 = fVar14 * -0.003 + (state->camera_angle).y;
    (state->camera_angle).y = fVar7;
    fVar14 = 1.4835298;
    if ((1.4835298 < fVar7) || (fVar14 = -1.4835298, fVar7 < -1.4835298)) {
      (state->camera_angle).y = fVar14;
    }
    fVar14 = *(float *)(uVar2 + 4);
    fVar13 = sinf(fVar13);
    *(float *)(uVar2 + 0x10) = fVar14 - fVar13 * 25.0;
    fVar14 = *(float *)(uVar2 + 8);
    fVar13 = sinf((state->camera_angle).y);
    *(float *)(uVar2 + 0x14) = fVar13 * 25.0 + fVar14;
    fVar14 = *(float *)(uVar2 + 0xc);
    fVar13 = cosf((state->camera_angle).x);
    *(float *)(uVar2 + 0x18) = fVar14 - fVar13 * 25.0;
    if (bVar5) {
      state->swing_counter = state->swing_counter + 1;
    }
    fVar14 = state->player_eyes_position;
    fVar13 = sinf((float)state->swing_counter / 5.0);
    *(float *)(uVar2 + 8) = fVar13 / -30.0 + fVar14;
    fVar14 = sinf((float)state->swing_counter / 10.0);
    *(float *)(uVar2 + 0x1c) = fVar14 / 200.0;
    fVar14 = sinf((float)state->swing_counter / 10.0);
    *(float *)(uVar2 + 0x24) = fVar14 / -200.0;
    return;
  case RF_CAMERA_THIRD_PERSON:
    local_38 = (float)input_state.mouse_wheel_move;
    fVar7 = sinf((state->camera_angle).x);
    fVar8 = (float)input_state.direction_keys[1];
    fVar9 = sinf((state->camera_angle).x);
    fVar12 = (float)input_state.direction_keys[0];
    fVar10 = cosf((state->camera_angle).x);
    local_3c = (float)input_state.direction_keys[3];
    fVar10 = fVar10 * local_3c;
    fVar11 = cosf((state->camera_angle).x);
    local_34 = (float)input_state.direction_keys[2];
    camera = (rf_camera3d *)local_58._0_8_;
    ((rf_vec3 *)(local_58._0_8_ + 4))->x =
         (fVar11 * local_34 + ((fVar7 * fVar8 - fVar9 * fVar12) - fVar10)) / 20.0 +
         ((rf_vec3 *)(local_58._0_8_ + 4))->x;
    fVar7 = sinf((state->camera_angle).y);
    fVar9 = sinf((state->camera_angle).y);
    ((rf_vec3 *)((long)camera + 4))->y =
         (((float)input_state.direction_keys[4] + (fVar7 * fVar12 - fVar9 * fVar8)) -
         (float)input_state.direction_keys[5]) / 20.0 + ((rf_vec3 *)((long)camera + 4))->y;
    fVar7 = cosf((state->camera_angle).x);
    fVar9 = cosf((state->camera_angle).x);
    fVar10 = sinf((state->camera_angle).x);
    fVar10 = fVar10 * local_3c;
    fVar11 = sinf((state->camera_angle).x);
    ((rf_vec3 *)((long)camera + 4))->z =
         ((fVar10 + (fVar7 * fVar8 - fVar9 * fVar12)) - fVar11 * local_34) / 20.0 +
         ((rf_vec3 *)((long)camera + 4))->z;
    fVar7 = fVar13 * -0.003 + (state->camera_angle).x;
    (state->camera_angle).x = fVar7;
    fVar13 = fVar14 * -0.003 + (state->camera_angle).y;
    (state->camera_angle).y = fVar13;
    fVar14 = 0.08726646;
    if ((0.08726646 < fVar13) || (fVar14 = -1.4835298, fVar13 < -1.4835298)) {
      (state->camera_angle).y = fVar14;
    }
    fVar13 = (float)(int)local_38 * -1.5 + state->camera_target_distance;
    fVar14 = 1.2;
    if (1.2 <= fVar13) {
      fVar14 = fVar13;
    }
    state->camera_target_distance = fVar14;
    fVar13 = sinf(fVar7);
    fVar14 = state->camera_target_distance;
    fVar7 = cosf((state->camera_angle).y);
    ((rf_vec3 *)((long)camera + 4))->x =
         fVar7 * fVar13 * fVar14 + ((rf_vec3 *)((long)camera + 0x10))->x;
    fVar14 = (state->camera_angle).y;
    fVar13 = sinf(fVar14);
    if (0.0 < fVar14) {
      fVar13 = -fVar13;
    }
    fVar13 = fVar13 * state->camera_target_distance;
    break;
  default:
    goto switchD_00126718_default;
  }
  fVar14 = sinf((state->camera_angle).y);
  (camera->position).y = fVar14 * fVar13 + (camera->target).y;
  fVar13 = cosf((state->camera_angle).x);
  fVar14 = state->camera_target_distance;
  fVar7 = cosf((state->camera_angle).y);
  fVar7 = fVar7 * fVar13 * fVar14;
LAB_00127187:
  (camera->position).z = fVar7 + (camera->target).z;
switchD_00126718_default:
  return;
}

Assistant:

RF_API void rf_update_camera3d(rf_camera3d* camera, rf_camera3d_state* state, rf_input_state_for_update_camera input_state)
{
    // rf_camera3d mouse movement sensitivity
    #define RF_CAMERA_MOUSE_MOVE_SENSITIVITY 0.003f
    #define RF_CAMERA_MOUSE_SCROLL_SENSITIVITY 1.5f

    // FREE_CAMERA
    #define RF_CAMERA_FREE_MOUSE_SENSITIVITY 0.01f
    #define RF_CAMERA_FREE_DISTANCE_MIN_CLAMP 0.3f
    #define RF_CAMERA_FREE_DISTANCE_MAX_CLAMP 120.0f
    #define RF_CAMERA_FREE_MIN_CLAMP 85.0f
    #define RF_CAMERA_FREE_MAX_CLAMP -85.0f
    #define RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY 0.05f
    #define RF_CAMERA_FREE_PANNING_DIVIDER 5.1f

    // ORBITAL_CAMERA
    #define RF_CAMERA_ORBITAL_SPEED 0.01f // Radians per frame

    // FIRST_PERSON
    //#define CAMERA_FIRST_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE 25.0f
    #define RF_CAMERA_FIRST_PERSON_MIN_CLAMP 85.0f
    #define RF_CAMERA_FIRST_PERSON_MAX_CLAMP -85.0f

    #define RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER 5.0f
    #define RF_CAMERA_FIRST_PERSON_STEP_DIVIDER 30.0f
    #define RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER 200.0f

    // THIRD_PERSON
    //#define CAMERA_THIRD_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP 1.2f
    #define RF_CAMERA_THIRD_PERSON_MIN_CLAMP 5.0f
    #define RF_CAMERA_THIRD_PERSON_MAX_CLAMP -85.0f
    #define RF_CAMERA_THIRD_PERSON_OFFSET (rf_vec3) { 0.4f, 0.0f, 0.0f }

    // PLAYER (used by camera)
    #define RF_PLAYER_MOVEMENT_SENSITIVITY 20.0f

    // rf_camera3d move modes (first person and third person cameras)
    typedef enum rf_camera_move
    {
        rf_move_front = 0,
        rf_move_back,
        rf_move_right,
        rf_move_left,
        rf_move_up,
        rf_move_down
    } rf_camera_move;

    // RF_INTERNAL float player_eyes_position = 1.85f;

    // TODO: CRF_INTERNAL rf_ctx->gl_ctx.camera_target_distance and rf_ctx->gl_ctx.camera_angle here

    // Mouse movement detection
    rf_vec2 mouse_position_delta = { 0.0f, 0.0f };
    rf_vec2 mouse_position = input_state.mouse_position;
    int mouse_wheel_move = input_state.mouse_wheel_move;

    // Keys input detection
    bool pan_key = input_state.is_camera_pan_control_key_down;
    bool alt_key = input_state.is_camera_alt_control_key_down;
    bool szoom_key = input_state.is_camera_smooth_zoom_control_key;

    bool direction[6];
    direction[0] = input_state.direction_keys[0];
    direction[1] = input_state.direction_keys[1];
    direction[2] = input_state.direction_keys[2];
    direction[3] = input_state.direction_keys[3];
    direction[4] = input_state.direction_keys[4];
    direction[5] = input_state.direction_keys[5];

    // TODO: Consider touch inputs for camera

    if (state->camera_mode != RF_CAMERA_CUSTOM)
    {
        mouse_position_delta.x = mouse_position.x - state->previous_mouse_position.x;
        mouse_position_delta.y = mouse_position.y - state->previous_mouse_position.y;

        state->previous_mouse_position = mouse_position;
    }

    // Support for multiple automatic camera modes
    switch (state->camera_mode)
    {
        case RF_CAMERA_FREE:
        {
            // Camera zoom
            if ((state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

                if (state->camera_target_distance > RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MAX_CLAMP;
                }
            }
            // Camera looking down
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y > camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y >= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y < 0) camera->target.y = -0.001;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y < 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }
            // Camera looking up
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y < camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y <= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y > 0) camera->target.y = 0.001;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y > 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }

            // Input keys checks
            if (pan_key)
            {
                if (alt_key) // Alternative key behaviour
                {
                    if (szoom_key)
                    {
                        // Camera smooth zoom
                        state->camera_target_distance += (mouse_position_delta.y * RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY);
                    }
                    else
                    {
                        // Camera rotation
                        state->camera_angle.x += mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;
                        state->camera_angle.y += mouse_position_delta.y*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;

                        // Angle clamp
                        if (state->camera_angle.y > RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD;
                        }
                        else if (state->camera_angle.y < RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD;
                        }
                    }
                }
                else
                {
                    // Camera panning
                    camera->target.x += ((mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.y += ((mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.z += ((mouse_position_delta.x * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                }
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_ORBITAL:
        {
            state->camera_angle.x += RF_CAMERA_ORBITAL_SPEED; // Camera orbit angle
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY); // Camera zoom

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP) {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_FIRST_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            bool is_moving = false; // Required for swinging

            for (rf_int i = 0; i < 6; i++) if (direction[i]) { is_moving = true; break; }

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera is always looking at player
            camera->target.x = camera->position.x - sinf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.y = camera->position.y + sinf(state->camera_angle.y) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.z = camera->position.z - cosf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;

            if (is_moving) {
                state->swing_counter++;
            }

            // Camera position update
            // NOTE: On RF_CAMERA_FIRST_PERSON player Y-movement is limited to player 'eyes position'
            camera->position.y = state->player_eyes_position - sinf(state->swing_counter / RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER) / RF_CAMERA_FIRST_PERSON_STEP_DIVIDER;

            camera->up.x = sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;
            camera->up.z = -sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;

        } break;

        case RF_CAMERA_THIRD_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera zoom
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP)
            {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // TODO: It seems camera->position is not correctly updated or some rounding issue makes the camera move straight to camera->target...
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;

            if (state->camera_angle.y <= 0.0f)
            {
                camera->position.y = sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }
            else
            {
                camera->position.y = -sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }

            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        default: break;
    }
}